

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.cpp
# Opt level: O3

void __thiscall FlatZinc::FlatZincSpace::newIntVar(FlatZincSpace *this,IntVarSpec *vs,string *name)

{
  SetLit *pSVar1;
  pointer pcVar2;
  _Bit_type *p_Var3;
  pointer piVar4;
  bool bVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  IntVarSL *this_00;
  ulong uVar10;
  IntVar **ppIVar11;
  int iVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  size_type __new_size;
  int *i;
  pointer elem;
  uint local_68;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  uint uVar9;
  
  uVar7 = this->intVarCount;
  if (uVar7 == (this->iv).sz) {
    __new_size = 1;
    if (0 < (int)uVar7) {
      __new_size = (size_type)(uVar7 * 2);
    }
    vec<IntVar_*>::growTo(&this->iv,(uint)__new_size);
    std::vector<bool,_std::allocator<bool>_>::resize(&this->iv_introduced,__new_size,false);
  }
  if (so.use_var_is_introduced == true) {
    bVar13 = (vs->super_VarSpec).introduced;
  }
  else {
    bVar13 = (vs->super_VarSpec).output ^ 1;
  }
  bVar14 = bVar13;
  if ((so.introduced_heuristic == true) &&
     (bVar14 = 1, (vs->super_VarSpec).looks_introduced == false)) {
    bVar14 = bVar13;
  }
  if ((vs->super_VarSpec).alias == true) {
    ppIVar11 = (this->iv).data;
    this_00 = (IntVarSL *)ppIVar11[(uint)(vs->super_VarSpec).i];
    uVar7 = this->intVarCount;
    this->intVarCount = uVar7 + 1;
  }
  else {
    if ((vs->super_VarSpec).assigned == true) {
      this_00 = (IntVarSL *)getConstant(uVar9);
    }
    else if ((vs->domain)._some == true) {
      pSVar1 = (vs->domain)._v;
      if (pSVar1->interval == true) {
        this_00 = (IntVarSL *)::newIntVar(pSVar1->min,pSVar1->max);
        pcVar2 = (name->_M_dataplus)._M_p;
        local_58 = (undefined1  [8])this_00;
        local_50._M_p = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
        std::
        _Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<IntVar*,std::__cxx11::string>>
                  ((_Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
                    *)&intVarString_abi_cxx11_,
                   (pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_58);
        if (local_50._M_p != local_40) {
          operator_delete(local_50._M_p);
        }
      }
      else {
        uVar15 = 0xffffffff;
        _local_68 = 0;
        elem = (pSVar1->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        piVar4 = (pSVar1->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (elem != piVar4) {
          do {
            vec<int>::push((vec<int> *)&local_68,elem);
            elem = elem + 1;
          } while (elem != piVar4);
          uVar10 = _local_68 & 0xffffffff;
          uVar15 = 0xffffffff;
          if (uVar10 != 0) {
            lVar6 = 0x3f;
            if (uVar10 != 0) {
              for (; local_68 >> lVar6 == 0; lVar6 = lVar6 + -1) {
              }
            }
            std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (0,uVar10 * 4,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
            std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(0,uVar10 * 4);
            uVar15 = (ulong)(local_68 - 1);
          }
        }
        this_00 = (IntVarSL *)::newIntVar(iRam0000000000000000,*(int *)(uVar15 * 4));
        pcVar2 = (name->_M_dataplus)._M_p;
        local_58 = (undefined1  [8])this_00;
        local_50._M_p = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
        std::
        _Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<IntVar*,std::__cxx11::string>>
                  ((_Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
                    *)&intVarString_abi_cxx11_,
                   (pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_58);
        if (local_50._M_p != local_40) {
          operator_delete(local_50._M_p);
        }
        iVar8 = *(int *)((ulong)(local_68 - 1) * 4) - iRam0000000000000000;
        iVar12 = -1;
        uVar7 = local_68;
        if (local_68 != 0) {
          do {
            iVar12 = iVar12 + 1;
            bVar5 = 1 < uVar7;
            uVar7 = (int)uVar7 >> 1;
          } while (bVar5);
        }
        if ((iVar8 < (int)(iVar12 * local_68)) &&
           ((so.eager_limit < (int)local_68 || (iVar8 < so.eager_limit)))) {
          iVar8 = (*(this_00->super_IntVar).super_Var.super_Branching._vptr_Branching[0x12])
                            (this_00,&local_68,0,1);
          if ((char)iVar8 == '\0') {
            puts("=====UNSATISFIABLE=====");
            printf("%% Top level failure!\n");
            exit(0);
          }
        }
        else {
          IntVarSL::IntVarSL(this_00,(IntVar *)this_00,(vec<int> *)&local_68);
        }
      }
    }
    else {
      this_00 = (IntVarSL *)::newIntVar(-500000000,500000000);
    }
    if ((so.exclude_introduced == true) && (bVar14 != 0)) {
      (this_00->super_IntVar).should_be_learnable = false;
    }
    if ((so.decide_introduced == false) && (bVar14 != 0)) {
      (this_00->super_IntVar).should_be_decidable = false;
    }
    uVar7 = this->intVarCount;
    this->intVarCount = uVar7 + 1;
    ppIVar11 = (this->iv).data;
  }
  ppIVar11[uVar7] = &this_00->super_IntVar;
  uVar9 = uVar7 + 0x3f;
  if (-1 < (int)uVar7) {
    uVar9 = uVar7;
  }
  iVar8 = (int)uVar9 >> 6;
  p_Var3 = (this->iv_introduced).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar10 = (ulong)(((long)(int)uVar7 & 0x800000000000003fU) < 0x8000000000000001);
  uVar15 = 1L << ((byte)uVar7 & 0x3f);
  if (bVar14 == 0) {
    uVar15 = ~uVar15 & p_Var3[(long)iVar8 + uVar10 + 0xffffffffffffffff];
  }
  else {
    uVar15 = uVar15 | p_Var3[(long)iVar8 + uVar10 + 0xffffffffffffffff];
  }
  p_Var3[(long)iVar8 + uVar10 + 0xffffffffffffffff] = uVar15;
  return;
}

Assistant:

void FlatZincSpace::newIntVar(IntVarSpec* vs, const std::string& name) {
	// Resizing of the vectors if required
	if (intVarCount == static_cast<int>(iv.size())) {
		const int newSize = intVarCount > 0 ? 2 * intVarCount : 1;
		iv.growTo(newSize);
		iv_introduced.resize(newSize);
	}
	bool considerIntroduced = false;
	if (so.use_var_is_introduced) {
		considerIntroduced = vs->introduced;
	} else {
		considerIntroduced = !vs->output;
	}
	if (so.introduced_heuristic && vs->looks_introduced) {
		considerIntroduced = true;
	}
	if (vs->alias) {
		iv[intVarCount++] = iv[vs->i];
	} else {
		IntVar* v = nullptr;
		if (vs->assigned) {
			v = getConstant(vs->i);
		} else if (vs->domain()) {
			AST::SetLit* sl = vs->domain.some();
			if (sl->interval) {
				v = ::newIntVar(sl->min, sl->max);
				intVarString.insert(std::pair<IntVar*, std::string>(v, name));
			} else {
				vec<int> d;
				for (const int& i : sl->s) {
					d.push(i);
				}
				std::sort((int*)d, (int*)d + d.size());
				v = ::newIntVar(d[0], d.last());
				intVarString.insert(std::pair<IntVar*, std::string>(v, name));
				if ((d.last() - d[0] >= static_cast<int>(d.size() * mylog2(d.size()))) ||
						(static_cast<int>(d.size()) <= so.eager_limit &&
						 (d.last() - d[0] + 1) > so.eager_limit)) {
					new (v) IntVarSL(*v, d);
				} else {
					if (!v->allowSet(d)) {
						TL_FAIL();
					}
				}
			}
		} else {
			v = ::newIntVar();
		}
		/* std::cerr << "int var: " << intVarCount << " " << v << "\n"; */

		if (so.exclude_introduced && considerIntroduced) {
			v->should_be_learnable = false;
		}
		if (!so.decide_introduced && considerIntroduced) {
			v->should_be_decidable = false;
		}
		iv[intVarCount++] = v;
	}
	iv_introduced[intVarCount - 1] = considerIntroduced;
}